

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O3

void __thiscall dg::vr::Bucket::disconnect(Bucket *this)

{
  pointer __src;
  Type TVar1;
  pointer prVar2;
  Bucket *pBVar3;
  uint uVar4;
  pointer prVar5;
  long lVar6;
  ulong uVar7;
  
  lVar6 = 0;
  do {
    TVar1 = *(Type *)((long)&Relations::all + lVar6);
    uVar7 = (ulong)TVar1;
    if ((uVar7 == 0) &&
       (prVar2 = (this->relatedBuckets)._M_elems[0].vec.
                 super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (this->relatedBuckets)._M_elems[0].vec.
       super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
       ._M_impl.super__Vector_impl_data._M_finish != prVar2)) {
      (this->relatedBuckets)._M_elems[0].vec.
      super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = prVar2;
    }
    prVar2 = (this->relatedBuckets)._M_elems[uVar7].vec.
             super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    prVar5 = (this->relatedBuckets)._M_elems[uVar7].vec.
             super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while (prVar2 != prVar5) {
      pBVar3 = prVar2->_M_data;
      if (this->id != pBVar3->id) {
        uVar4 = dg::vr::Relations::inverted(TVar1);
        VectorSet<std::reference_wrapper<dg::vr::Bucket>>::erase<dg::vr::Bucket,bool>
                  ((VectorSet<std::reference_wrapper<dg::vr::Bucket>> *)
                   ((pBVar3->relatedBuckets)._M_elems + uVar4),this);
        prVar5 = (this->relatedBuckets)._M_elems[uVar7].vec.
                 super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      __src = prVar2 + 1;
      if (__src != prVar5) {
        memmove(prVar2,__src,(long)prVar5 - (long)__src);
        prVar5 = (this->relatedBuckets)._M_elems[uVar7].vec.
                 super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      prVar5 = prVar5 + -1;
      (this->relatedBuckets)._M_elems[uVar7].vec.
      super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = prVar5;
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x30);
  return;
}

Assistant:

void disconnect() {
        for (Relations::Type type : Relations::all) {
            if (type == Relations::EQ) {
                assert(relatedBuckets[type].size() == 1);
                relatedBuckets[type].clear();
            }
            for (auto it = relatedBuckets[type].begin();
                 it != relatedBuckets[type].end();
                 /*incremented by erase*/) {
                if (*this != *it)
                    it->get().relatedBuckets[Relations::inverted(type)].erase(
                            *this);
                it = relatedBuckets[type].erase(it);
            }
        }
        assert(!hasAnyRelation());
    }